

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

int assert_ptr_eq(void *a,void *b,char *testcase,int line)

{
  undefined4 in_register_0000000c;
  
  test_counter = test_counter + 1;
  if (a == b) {
    printf("ok %d - %s...\n",(ulong)(uint)test_counter,testcase,CONCAT44(in_register_0000000c,line))
    ;
  }
  else {
    printf("not ok %d - %s...\n",(ulong)(uint)test_counter,testcase,
           CONCAT44(in_register_0000000c,line));
    printf("# Expected %p, but observed %p instead (line %d)\n",a,b,(ulong)(uint)line);
    global_err = global_err + 1;
  }
  return (uint)(a != b);
}

Assistant:

int assert_ptr_eq(const void* a, const void* b, const char *testcase, int line)
{
    test_counter++;
    int err = a!=b;
    if(err) {
        printf("not ok %d - %s...\n", test_counter, testcase);
        printf("# Expected %p, but observed %p instead (line %d)\n", a, b, line);
        global_err++;
    } else
        printf("ok %d - %s...\n", test_counter, testcase);
    return err;
}